

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

void __thiscall phpconvert::ZendParser::replaceTypes(ZendParser *this,File *file)

{
  bool bVar1;
  reference type_00;
  PreparedType *type;
  iterator __end1;
  iterator __begin1;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  *__range1;
  File *file_local;
  ZendParser *this_local;
  
  __end1 = std::
           vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
           ::begin(&file->prepTypes);
  type = (PreparedType *)
         std::
         vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
         ::end(&file->prepTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
                                *)&type);
    if (!bVar1) break;
    type_00 = __gnu_cxx::
              __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
              ::operator*(&__end1);
    replaceType(this,type_00,file);
    __gnu_cxx::
    __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ZendParser::replaceTypes(File &file) {
//        vector<PreparedType> tmp;
        for (PreparedType &type: file.prepTypes) {
//		cout << type.type + "-" +type.alias + "\n";
//            if (isBuiltInType(type)) {
            replaceType(type, file);
//            }
        }
    }